

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall FIX::double_conversion::Bignum::AssignBignum(Bignum *this,Bignum *other)

{
  uint uVar1;
  uint *puVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Bignum *other_local;
  Bignum *this_local;
  
  this->exponent_ = other->exponent_;
  for (local_1c = 0; local_1c < other->used_digits_; local_1c = local_1c + 1) {
    puVar2 = Vector<unsigned_int>::operator[](&other->bigits_,local_1c);
    uVar1 = *puVar2;
    puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,local_1c);
    *puVar2 = uVar1;
  }
  for (local_20 = other->used_digits_; local_20 < this->used_digits_; local_20 = local_20 + 1) {
    puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,local_20);
    *puVar2 = 0;
  }
  this->used_digits_ = other->used_digits_;
  return;
}

Assistant:

void Bignum::AssignBignum(const Bignum& other) {
  exponent_ = other.exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    bigits_[i] = other.bigits_[i];
  }
  // Clear the excess digits (if there were any).
  for (int i = other.used_digits_; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = other.used_digits_;
}